

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void plot_horizontal_tiles_common
               (tgestate_t *state,tileindex_t *vistiles,supertileindex_t *maptiles,uint8_t y,
               uint8_t *window)

{
  byte bVar1;
  byte bVar2;
  tileindex_t tVar3;
  tileindex_t *ptVar4;
  uint uVar5;
  byte *maptiles_00;
  long lVar6;
  byte bVar7;
  byte bVar8;
  tileindex_t *ptVar9;
  char cVar10;
  long lVar11;
  
  uVar5 = (y & 3) << 2;
  bVar1 = (state->map_position).x;
  bVar2 = *maptiles;
  bVar7 = -(bVar1 + 0xb0) & 3;
  bVar8 = 4;
  if (bVar7 != 0) {
    bVar8 = bVar7;
  }
  lVar6 = 0;
  do {
    tVar3 = supertiles[0].tiles[lVar6 + (ulong)(bVar1 & 3 | uVar5 | (uint)bVar2 << 4)];
    vistiles[lVar6] = tVar3;
    window = plot_tile(state,tVar3,maptiles,window);
    lVar6 = lVar6 + 1;
  } while (bVar8 != (byte)lVar6);
  maptiles_00 = maptiles + 1;
  cVar10 = '\x05';
  ptVar4 = vistiles + lVar6;
  do {
    ptVar9 = ptVar4;
    bVar1 = *maptiles_00;
    lVar6 = 0;
    do {
      tVar3 = supertiles[bVar1].tiles[lVar6 + (ulong)uVar5];
      ptVar9[lVar6] = tVar3;
      window = plot_tile(state,tVar3,maptiles_00,window);
      lVar6 = lVar6 + 1;
    } while ((char)lVar6 != '\x04');
    maptiles_00 = maptiles_00 + 1;
    cVar10 = cVar10 + -1;
    ptVar4 = ptVar9 + lVar6;
  } while (cVar10 != '\0');
  bVar1 = (state->map_position).x;
  if ((bVar1 & 3) != 0) {
    bVar2 = *maptiles_00;
    lVar11 = 0;
    do {
      tVar3 = supertiles[bVar2].tiles[lVar11 + (ulong)uVar5];
      ptVar9[lVar6 + lVar11] = tVar3;
      window = plot_tile(state,tVar3,maptiles_00,window);
      lVar11 = lVar11 + 1;
    } while ((bVar1 & 3) != (byte)lVar11);
  }
  return;
}

Assistant:

void plot_horizontal_tiles_common(tgestate_t             *state,
                                  tileindex_t            *vistiles,
                                  const supertileindex_t *maptiles,
                                  uint8_t                 y,
                                  uint8_t                *window)
{
  /* Conv: self_A86A removed. Can be replaced with pos_copy. */

  uint8_t            y_offset;  /* was Cdash */
  const tileindex_t *tiles;     /* was HL */
  uint8_t            A;         /* was A */
  uint8_t            iters;     /* was B */
  uint8_t            iters2;    /* was B' */
  uint8_t            offset;    // new or A' ?

  assert(state != NULL);
  ASSERT_TILE_BUF_PTR_VALID(vistiles);
  ASSERT_MAP_BUF_PTR_VALID(maptiles);
  // assert(y);
  ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

  y_offset = (y & 3) * 4;
  ASSERT_MAP_POSITION_VALID(state->map_position);
  offset = (state->map_position.x & 3) + y_offset;

  /* Initial edge. */

  assert(*maptiles < supertileindex__LIMIT);
  tiles = &supertiles[*maptiles].tiles[offset];
  ASSERT_SUPERTILE_PTR_VALID(tiles);

  A = tiles - &supertiles[0].tiles[0]; // Conv: Original code could simply use L.

  // 0,1,2,3 => 4,3,2,1
  A = -A & 3;
  if (A == 0)
    A = 4;

  iters = A; /* 1..4 iterations */
  do
  {
    tileindex_t t; /* was A */

    ASSERT_TILE_BUF_PTR_VALID(vistiles);
    ASSERT_SUPERTILE_PTR_VALID(tiles);

    // Conv: Fused accesses and increments.
    t = *vistiles++ = *tiles++; // A = tile index
    window = plot_tile(state, t, maptiles, window);
  }
  while (--iters);

  maptiles++;

  /* Middle loop. */

  iters2 = 5;
  do
  {
    ASSERT_MAP_BUF_PTR_VALID(maptiles);
    assert(*maptiles < supertileindex__LIMIT);
    tiles = &supertiles[*maptiles].tiles[y_offset]; // self modified by $A82A

    iters = 4;
    do
    {
      tileindex_t t; /* was A */

      ASSERT_TILE_BUF_PTR_VALID(vistiles);
      ASSERT_SUPERTILE_PTR_VALID(tiles);

      t = *vistiles++ = *tiles++; // A = tile index
      window = plot_tile(state, t, maptiles, window);
    }
    while (--iters);

    maptiles++;
  }
  while (--iters2);

  /* Trailing edge. */

  //A = pos_copy; // an apparently unused assignment

  ASSERT_MAP_BUF_PTR_VALID(maptiles);
  assert(*maptiles < supertileindex__LIMIT);
  tiles = &supertiles[*maptiles].tiles[y_offset]; // read of self modified instruction
  // Conv: A was A'.
  A = state->map_position.x & 3; // map_position lo (repeats earlier work)
  if (A == 0)
    return; /* can skip trailing edge */

  iters = A;
  do
  {
    tileindex_t t; /* was Adash */

    ASSERT_TILE_BUF_PTR_VALID(vistiles);
    ASSERT_SUPERTILE_PTR_VALID(tiles);

    t = *vistiles++ = *tiles++; // Adash = tile index
    window = plot_tile(state, t, maptiles, window);
  }
  while (--iters);
}